

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRasterizer.cpp
# Opt level: O3

void __thiscall
rr::TriangleRasterizer::rasterizeMultiSample<8>
          (TriangleRasterizer *this,FragmentPacket *fragmentPackets,float *depthValues,
          int maxFragmentPackets,int *numPacketsRasterized)

{
  Vec4 *pVVar1;
  float fVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  TriangleRasterizer *pTVar8;
  int iVar9;
  long *plVar10;
  long lVar11;
  ulong uVar12;
  byte bVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  int iVar18;
  undefined8 *puVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  long lVar24;
  int iVar25;
  int iVar26;
  long lVar27;
  ulong uVar28;
  long lVar29;
  ulong uVar30;
  long *plVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  Vector<float,_4> res_2;
  Vector<float,_4> res_1;
  Vector<float,_4> res;
  deInt64 sy [4];
  Vector<long,_4> e20 [8];
  Vector<long,_4> e12 [8];
  Vector<long,_4> e01 [8];
  float local_428 [4];
  undefined8 local_418;
  float fStack_410;
  float fStack_40c;
  float local_408 [4];
  TriangleRasterizer *local_3f8;
  ulong local_3f0;
  ulong local_3e8;
  long local_3e0;
  long local_3d8;
  long local_3d0;
  long local_3c8;
  long local_3c0;
  long local_3b8;
  long local_3b0;
  long local_3a8;
  long local_3a0;
  int *local_398;
  FragmentPacket *local_390;
  float *local_388;
  long local_380;
  long local_378 [4];
  long local_358 [2];
  int local_348;
  int iStack_344;
  long lStack_340;
  undefined8 local_338;
  long local_330 [28];
  long alStack_250 [32];
  long alStack_150 [36];
  
  uVar16 = (this->m_curPos).m_data[1];
  iVar25 = (this->m_bboxMax).m_data[1];
  iVar26 = 0;
  local_398 = numPacketsRasterized;
  if (0 < maxFragmentPackets && (int)uVar16 <= iVar25) {
    fVar2 = (this->m_v2).m_data[2];
    fVar40 = (this->m_v0).m_data[2] - fVar2;
    fVar41 = (this->m_v1).m_data[2] - fVar2;
    iVar26 = 0;
    local_3f8 = this;
    local_390 = fragmentPackets;
    local_388 = depthValues;
    do {
      pTVar8 = local_3f8;
      local_3e8 = (ulong)uVar16;
      uVar3 = (local_3f8->m_curPos).m_data[0];
      local_3f0 = (ulong)uVar3;
      local_378[0] = (long)(int)(uVar16 << 8);
      iVar14 = uVar16 + 1;
      local_378[2] = (long)(iVar14 * 0x100);
      iVar18 = uVar3 + 1;
      local_338._0_4_ = iVar18 * 0x100;
      local_338._4_4_ = -(uint)((int)local_338 < 0);
      local_358[0] = CONCAT44(-(uint)((int)(uVar3 << 8) < 0),uVar3 << 8);
      _local_348 = CONCAT44(local_338._4_4_,(int)local_338);
      iVar9 = (local_3f8->m_viewport).m_data[2] + (local_3f8->m_viewport).m_data[0];
      iVar15 = (local_3f8->m_viewport).m_data[3] + (local_3f8->m_viewport).m_data[1];
      plVar10 = alStack_150 + 3;
      local_378[1] = local_378[0];
      local_378[3] = local_378[2];
      memset(plVar10,0,0x100);
      plVar31 = alStack_250 + 3;
      memset(plVar31,0,0x100);
      puVar19 = &local_338;
      memset(puVar19,0,0x100);
      local_3a0 = (pTVar8->m_edge01).a;
      local_3b8 = (pTVar8->m_edge01).b;
      local_3c0 = (pTVar8->m_edge01).c;
      local_3c8 = (pTVar8->m_edge12).a;
      local_3d0 = (pTVar8->m_edge12).b;
      local_3d8 = (pTVar8->m_edge12).c;
      local_3a8 = (pTVar8->m_edge20).a;
      local_3e0 = (pTVar8->m_edge20).b;
      local_3b0 = (pTVar8->m_edge20).c;
      lVar23 = 0;
      do {
        local_380 = lVar23;
        lVar23 = (&s_samplePos8)[local_380 * 2];
        lVar29 = (&DAT_00234df8)[local_380 * 2];
        lVar24 = 0;
        do {
          lVar27 = local_358[lVar24] + lVar23;
          lVar11 = local_378[lVar24] + lVar29;
          plVar10[lVar24] = local_3b8 * lVar11 + local_3a0 * lVar27 + local_3c0;
          plVar31[lVar24] = local_3d0 * lVar11 + local_3c8 * lVar27 + local_3d8;
          puVar19[lVar24] = lVar11 * local_3e0 + lVar27 * local_3a8 + local_3b0;
          lVar24 = lVar24 + 1;
        } while (lVar24 != 4);
        puVar19 = puVar19 + 4;
        plVar31 = plVar31 + 4;
        plVar10 = plVar10 + 4;
        lVar23 = local_380 + 1;
      } while (local_380 + 1 != 8);
      uVar30 = (ulong)(local_3f8->m_edge01).inclusive;
      lVar24 = -uVar30;
      uVar22 = (ulong)(local_3f8->m_edge12).inclusive;
      lVar23 = -uVar22;
      uVar28 = (ulong)(local_3f8->m_edge20).inclusive;
      lVar29 = -uVar28;
      lVar11 = 0x18;
      uVar17 = 0;
      uVar20 = 0;
      do {
        lVar27 = *(long *)((long)alStack_150 + lVar11);
        if ((lVar27 == lVar24 || SBORROW8(lVar27,lVar24) != (long)(lVar27 + uVar30) < 0) ||
           (lVar27 = *(long *)((long)alStack_250 + lVar11),
           lVar27 == lVar23 || SBORROW8(lVar27,lVar23) != (long)(lVar27 + uVar22) < 0)) {
          uVar21 = uVar20 & ~(1L << (uVar17 & 0x3f));
        }
        else {
          lVar27 = *(long *)((long)local_358 + lVar11 + 8);
          uVar21 = uVar20 & ~(1L << (uVar17 & 0x3f));
          if (lVar27 != lVar29 && SBORROW8(lVar27,lVar29) == (long)(lVar27 + uVar28) < 0) {
            uVar21 = uVar20 | 1L << (uVar17 & 0x3f);
          }
        }
        bVar13 = (byte)uVar17;
        if (((iVar18 == iVar9) ||
            (lVar27 = *(long *)((long)alStack_150 + lVar11 + 8),
            lVar27 == lVar24 || SBORROW8(lVar27,lVar24) != (long)(lVar27 + uVar30) < 0)) ||
           (lVar27 = *(long *)((long)alStack_250 + lVar11 + 8),
           lVar27 == lVar23 || SBORROW8(lVar27,lVar23) != (long)(lVar27 + uVar22) < 0)) {
          uVar20 = uVar21 & ~(0x10000L << (bVar13 & 0x3f));
        }
        else {
          uVar12 = 0x10000L << (bVar13 & 0x3f);
          lVar27 = *(long *)((long)&local_348 + lVar11);
          uVar20 = ~uVar12 & uVar21;
          if (lVar27 != lVar29 && SBORROW8(lVar27,lVar29) == (long)(lVar27 + uVar28) < 0) {
            uVar20 = uVar21 | uVar12;
          }
        }
        if (((iVar14 == iVar15) ||
            (lVar27 = *(long *)((long)alStack_150 + lVar11 + 0x10),
            lVar27 == lVar24 || SBORROW8(lVar27,lVar24) != (long)(lVar27 + uVar30) < 0)) ||
           (lVar27 = *(long *)((long)alStack_250 + lVar11 + 0x10),
           lVar27 == lVar23 || SBORROW8(lVar27,lVar23) != (long)(lVar27 + uVar22) < 0)) {
          uVar21 = uVar20 & ~(0x100L << (bVar13 & 0x3f));
        }
        else {
          uVar12 = 0x100L << (bVar13 & 0x3f);
          lVar27 = *(long *)((long)&lStack_340 + lVar11);
          uVar21 = ~uVar12 & uVar20;
          if (lVar27 != lVar29 && SBORROW8(lVar27,lVar29) == (long)(lVar27 + uVar28) < 0) {
            uVar21 = uVar20 | uVar12;
          }
        }
        if (((iVar14 == iVar15 || iVar18 == iVar9) ||
            (lVar27 = *(long *)((long)alStack_150 + lVar11 + 0x18),
            lVar27 == lVar24 || SBORROW8(lVar27,lVar24) != (long)(lVar27 + uVar30) < 0)) ||
           (lVar27 = *(long *)((long)alStack_250 + lVar11 + 0x18),
           lVar27 == lVar23 || SBORROW8(lVar27,lVar23) != (long)(lVar27 + uVar22) < 0)) {
          uVar20 = uVar21 & ~(0x1000000L << (bVar13 & 0x3f));
        }
        else {
          uVar12 = 0x1000000L << (bVar13 & 0x3f);
          lVar27 = *(long *)((long)local_330 + lVar11 + -8);
          uVar20 = ~uVar12 & uVar21;
          if (lVar27 != lVar29 && SBORROW8(lVar27,lVar29) == (long)(lVar27 + uVar28) < 0) {
            uVar20 = uVar21 | uVar12;
          }
        }
        uVar17 = uVar17 + 1;
        lVar11 = lVar11 + 0x20;
      } while (uVar17 != 8);
      iVar9 = (int)local_3f0 + 2;
      (local_3f8->m_curPos).m_data[0] = iVar9;
      uVar16 = (uint)local_3e8;
      if ((local_3f8->m_bboxMax).m_data[0] < iVar9) {
        uVar16 = uVar16 + 2;
        (local_3f8->m_curPos).m_data[1] = uVar16;
        (local_3f8->m_curPos).m_data[0] = (local_3f8->m_bboxMin).m_data[0];
      }
      if (uVar20 != 0) {
        if (local_388 != (float *)0x0) {
          puVar19 = &local_338;
          plVar10 = alStack_250 + 3;
          plVar31 = alStack_150 + 3;
          lVar23 = 0;
          do {
            local_408[0] = 0.0;
            local_408[1] = 0.0;
            local_408[2] = 0.0;
            local_408[3] = 0.0;
            lVar29 = 0;
            do {
              *(ulong *)(local_408 + lVar29) =
                   CONCAT44((float)plVar31[lVar29 + 1],(float)plVar31[lVar29]);
              lVar29 = lVar29 + 2;
            } while (lVar29 != 4);
            local_418._0_4_ = 0.0;
            local_418._4_4_ = 0.0;
            fStack_410 = 0.0;
            fStack_40c = 0.0;
            lVar29 = 0;
            do {
              *(ulong *)((long)&local_418 + lVar29 * 4) =
                   CONCAT44((float)plVar10[lVar29 + 1],(float)plVar10[lVar29]);
              lVar29 = lVar29 + 2;
            } while (lVar29 != 4);
            local_428[0] = 0.0;
            local_428[1] = 0.0;
            local_428[2] = 0.0;
            local_428[3] = 0.0;
            lVar29 = 0;
            do {
              *(ulong *)(local_428 + lVar29) =
                   CONCAT44((float)(long)puVar19[lVar29 + 1],(float)(long)puVar19[lVar29]);
              lVar29 = lVar29 + 2;
            } while (lVar29 != 4);
            auVar7._4_4_ = local_418._4_4_;
            auVar7._0_4_ = (float)local_418;
            auVar7._8_4_ = fStack_410;
            auVar7._12_4_ = fStack_40c;
            auVar6._4_4_ = local_428[1];
            auVar6._0_4_ = local_428[0];
            auVar6._8_4_ = local_428[2];
            auVar6._12_4_ = local_428[3];
            local_428[0] = local_408[0] + (float)local_418 + local_428[0];
            local_428[1] = local_408[1] + local_418._4_4_ + local_428[1];
            local_428[2] = local_408[2] + fStack_410 + local_428[2];
            local_428[3] = local_408[3] + fStack_40c + local_428[3];
            auVar32._4_4_ = local_428[1];
            auVar32._0_4_ = local_428[0];
            auVar32._8_4_ = local_428[2];
            auVar32._12_4_ = local_428[3];
            auVar32 = divps(auVar7,auVar32);
            auVar34._4_4_ = local_428[1];
            auVar34._0_4_ = local_428[0];
            auVar34._8_4_ = local_428[2];
            auVar34._12_4_ = local_428[3];
            auVar34 = divps(auVar6,auVar34);
            lVar29 = lVar23 + (iVar26 << 5);
            local_388[lVar29] = auVar32._0_4_ * fVar40 + fVar41 * auVar34._0_4_ + fVar2;
            local_388[lVar29 + 8] = auVar32._4_4_ * fVar40 + auVar34._4_4_ * fVar41 + fVar2;
            local_388[lVar29 + 0x10] = auVar32._8_4_ * fVar40 + auVar34._8_4_ * fVar41 + fVar2;
            local_388[lVar29 + 0x18] = auVar32._12_4_ * fVar40 + auVar34._12_4_ * fVar41 + fVar2;
            lVar23 = lVar23 + 1;
            plVar31 = plVar31 + 4;
            plVar10 = plVar10 + 4;
            puVar19 = puVar19 + 4;
          } while (lVar23 != 8);
        }
        local_408[0] = 0.0;
        local_408[1] = 0.0;
        local_408[2] = 0.0;
        local_408[3] = 0.0;
        local_418._0_4_ = 0.0;
        local_418._4_4_ = 0.0;
        fStack_410 = 0.0;
        fStack_40c = 0.0;
        local_428[0] = 0.0;
        local_428[1] = 0.0;
        local_428[2] = 0.0;
        local_428[3] = 0.0;
        lVar23 = 0;
        do {
          lVar29 = *(long *)((long)local_358 + lVar23 * 2) + 0x80;
          lVar24 = *(long *)((long)local_378 + lVar23 * 2) + 0x80;
          *(float *)((long)local_408 + lVar23) =
               (float)(local_3b8 * lVar24 + local_3a0 * lVar29 + local_3c0);
          *(float *)((long)&local_418 + lVar23) =
               (float)(local_3d0 * lVar24 + local_3c8 * lVar29 + local_3d8);
          *(float *)((long)local_428 + lVar23) =
               (float)(lVar24 * local_3e0 + lVar29 * local_3a8 + local_3b0);
          lVar23 = lVar23 + 4;
        } while (lVar23 != 0x10);
        fVar39 = (local_3f8->m_v0).m_data[3];
        auVar33._0_4_ = fVar39 * (float)local_418;
        auVar33._4_4_ = fVar39 * local_418._4_4_;
        auVar33._8_4_ = fVar39 * fStack_410;
        auVar33._12_4_ = fVar39 * fStack_40c;
        fVar39 = (local_3f8->m_v1).m_data[3];
        auVar35._0_4_ = fVar39 * local_428[0];
        auVar35._4_4_ = fVar39 * local_428[1];
        auVar35._8_4_ = fVar39 * local_428[2];
        auVar35._12_4_ = fVar39 * local_428[3];
        fVar39 = (local_3f8->m_v2).m_data[3];
        fVar36 = auVar33._0_4_ + auVar35._0_4_ + fVar39 * local_408[0];
        fVar37 = auVar33._4_4_ + auVar35._4_4_ + fVar39 * local_408[1];
        fVar38 = auVar33._8_4_ + auVar35._8_4_ + fVar39 * local_408[2];
        fVar39 = auVar33._12_4_ + auVar35._12_4_ + fVar39 * local_408[3];
        *(ulong *)local_390[iVar26].position.m_data = (local_3e8 << 0x20) + local_3f0;
        local_390[iVar26].coverage = uVar20;
        auVar4._4_4_ = fVar37;
        auVar4._0_4_ = fVar36;
        auVar4._8_4_ = fVar38;
        auVar4._12_4_ = fVar39;
        auVar32 = divps(auVar33,auVar4);
        *(undefined1 (*) [16])local_390[iVar26].barycentric[0].m_data = auVar32;
        auVar5._4_4_ = fVar37;
        auVar5._0_4_ = fVar36;
        auVar5._8_4_ = fVar38;
        auVar5._12_4_ = fVar39;
        auVar34 = divps(auVar35,auVar5);
        *(undefined1 (*) [16])local_390[iVar26].barycentric[1].m_data = auVar34;
        pVVar1 = local_390[iVar26].barycentric + 2;
        pVVar1->m_data[0] = (1.0 - auVar32._0_4_) - auVar34._0_4_;
        pVVar1->m_data[1] = (1.0 - auVar32._4_4_) - auVar34._4_4_;
        pVVar1->m_data[2] = (1.0 - auVar32._8_4_) - auVar34._8_4_;
        pVVar1->m_data[3] = (1.0 - auVar32._12_4_) - auVar34._12_4_;
        iVar26 = iVar26 + 1;
        iVar25 = (local_3f8->m_bboxMax).m_data[1];
        uVar16 = (local_3f8->m_curPos).m_data[1];
      }
    } while (((int)uVar16 <= iVar25) && (iVar26 < maxFragmentPackets));
  }
  *local_398 = iVar26;
  return;
}

Assistant:

void TriangleRasterizer::rasterizeMultiSample (FragmentPacket* const fragmentPackets, float* const depthValues, const int maxFragmentPackets, int& numPacketsRasterized)
{
	DE_ASSERT(maxFragmentPackets > 0);

	const deInt64*	samplePos	= DE_NULL;
	const deUint64	halfPixel	= 1ll << (RASTERIZER_SUBPIXEL_BITS-1);
	int				packetNdx	= 0;

	// For depth interpolation, see rasterizeSingleSample
	const float		za			= m_v0.z()-m_v2.z();
	const float		zb			= m_v1.z()-m_v2.z();
	const float		zc			= m_v2.z();

	switch (NumSamples)
	{
		case 2:		samplePos = s_samplePos2;	break;
		case 4:		samplePos = s_samplePos4;	break;
		case 8:		samplePos = s_samplePos8;	break;
		case 16:	samplePos = s_samplePos16;	break;
		default:
			DE_ASSERT(false);
	}

	while (m_curPos.y() <= m_bboxMax.y() && packetNdx < maxFragmentPackets)
	{
		const int		x0		= m_curPos.x();
		const int		y0		= m_curPos.y();

		// Base subpixel coords
		const deInt64	sx0		= toSubpixelCoord(x0);
		const deInt64	sx1		= toSubpixelCoord(x0+1);
		const deInt64	sy0		= toSubpixelCoord(y0);
		const deInt64	sy1		= toSubpixelCoord(y0+1);

		const deInt64	sx[4]	= { sx0, sx1, sx0, sx1 };
		const deInt64	sy[4]	= { sy0, sy0, sy1, sy1 };

		// Viewport test
		const bool		outX1	= x0+1 == m_viewport.x()+m_viewport.z();
		const bool		outY1	= y0+1 == m_viewport.y()+m_viewport.w();

		DE_ASSERT(x0 < m_viewport.x()+m_viewport.z());
		DE_ASSERT(y0 < m_viewport.y()+m_viewport.w());

		// Edge values
		tcu::Vector<deInt64, 4>	e01[NumSamples];
		tcu::Vector<deInt64, 4>	e12[NumSamples];
		tcu::Vector<deInt64, 4>	e20[NumSamples];

		// Coverage
		deUint64		coverage	= 0;

		// Evaluate edge values at sample positions
		for (int sampleNdx = 0; sampleNdx < NumSamples; sampleNdx++)
		{
			const deInt64 ox = samplePos[sampleNdx*2 + 0];
			const deInt64 oy = samplePos[sampleNdx*2 + 1];

			for (int fragNdx = 0; fragNdx < 4; fragNdx++)
			{
				e01[sampleNdx][fragNdx] = evaluateEdge(m_edge01, sx[fragNdx] + ox, sy[fragNdx] + oy);
				e12[sampleNdx][fragNdx] = evaluateEdge(m_edge12, sx[fragNdx] + ox, sy[fragNdx] + oy);
				e20[sampleNdx][fragNdx] = evaluateEdge(m_edge20, sx[fragNdx] + ox, sy[fragNdx] + oy);
			}
		}

		// Compute coverage mask
		for (int sampleNdx = 0; sampleNdx < NumSamples; sampleNdx++)
		{
			coverage = setCoverageValue(coverage, NumSamples, 0, 0, sampleNdx,						isInsideCCW(m_edge01, e01[sampleNdx][0]) && isInsideCCW(m_edge12, e12[sampleNdx][0]) && isInsideCCW(m_edge20, e20[sampleNdx][0]));
			coverage = setCoverageValue(coverage, NumSamples, 1, 0, sampleNdx, !outX1 &&			isInsideCCW(m_edge01, e01[sampleNdx][1]) && isInsideCCW(m_edge12, e12[sampleNdx][1]) && isInsideCCW(m_edge20, e20[sampleNdx][1]));
			coverage = setCoverageValue(coverage, NumSamples, 0, 1, sampleNdx, !outY1 &&			isInsideCCW(m_edge01, e01[sampleNdx][2]) && isInsideCCW(m_edge12, e12[sampleNdx][2]) && isInsideCCW(m_edge20, e20[sampleNdx][2]));
			coverage = setCoverageValue(coverage, NumSamples, 1, 1, sampleNdx, !outX1 && !outY1 &&	isInsideCCW(m_edge01, e01[sampleNdx][3]) && isInsideCCW(m_edge12, e12[sampleNdx][3]) && isInsideCCW(m_edge20, e20[sampleNdx][3]));
		}

		// Advance to next location
		m_curPos.x() += 2;
		if (m_curPos.x() > m_bboxMax.x())
		{
			m_curPos.y() += 2;
			m_curPos.x()  = m_bboxMin.x();
		}

		if (coverage == 0)
			continue; // Discard.

		// Compute depth values.
		if (depthValues)
		{
			for (int sampleNdx = 0; sampleNdx < NumSamples; sampleNdx++)
			{
				// Floating-point edge values at sample coordinates.
				const tcu::Vec4&	e01f	= e01[sampleNdx].asFloat();
				const tcu::Vec4&	e12f	= e12[sampleNdx].asFloat();
				const tcu::Vec4&	e20f	= e20[sampleNdx].asFloat();

				const tcu::Vec4		edgeSum	= e01f + e12f + e20f;
				const tcu::Vec4		z0		= e12f / edgeSum;
				const tcu::Vec4		z1		= e20f / edgeSum;

				depthValues[(packetNdx*4+0)*NumSamples + sampleNdx] = z0[0]*za + z1[0]*zb + zc;
				depthValues[(packetNdx*4+1)*NumSamples + sampleNdx] = z0[1]*za + z1[1]*zb + zc;
				depthValues[(packetNdx*4+2)*NumSamples + sampleNdx] = z0[2]*za + z1[2]*zb + zc;
				depthValues[(packetNdx*4+3)*NumSamples + sampleNdx] = z0[3]*za + z1[3]*zb + zc;
			}
		}

		// Compute barycentrics and write out fragment packet
		{
			FragmentPacket& packet = fragmentPackets[packetNdx];

			// Floating-point edge values at pixel center.
			tcu::Vec4			e01f;
			tcu::Vec4			e12f;
			tcu::Vec4			e20f;

			for (int i = 0; i < 4; i++)
			{
				e01f[i] = float(evaluateEdge(m_edge01, sx[i] + halfPixel, sy[i] + halfPixel));
				e12f[i] = float(evaluateEdge(m_edge12, sx[i] + halfPixel, sy[i] + halfPixel));
				e20f[i] = float(evaluateEdge(m_edge20, sx[i] + halfPixel, sy[i] + halfPixel));
			}

			// Barycentrics & scale.
			const tcu::Vec4		b0		= e12f * m_v0.w();
			const tcu::Vec4		b1		= e20f * m_v1.w();
			const tcu::Vec4		b2		= e01f * m_v2.w();
			const tcu::Vec4		bSum	= b0 + b1 + b2;

			packet.position			= tcu::IVec2(x0, y0);
			packet.coverage			= coverage;
			packet.barycentric[0]	= b0 / bSum;
			packet.barycentric[1]	= b1 / bSum;
			packet.barycentric[2]	= 1.0f - packet.barycentric[0] - packet.barycentric[1];

			packetNdx += 1;
		}
	}

	DE_ASSERT(packetNdx <= maxFragmentPackets);
	numPacketsRasterized = packetNdx;
}